

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerList<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
::TestBody(AssignmentFromInitializerList<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> *this_00;
  initializer_list<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> iVar1;
  bool bVar2;
  char *message;
  size_type sVar3;
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  *m_00;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> pVar4;
  initializer_list<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> xs;
  AssertHelper local_f90;
  Message local_f88;
  vector<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_f80;
  iterator local_f68;
  iterator ppStack_f60;
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>
  local_f50;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_f30;
  undefined1 local_f10 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_ef8 [3];
  StatefulTestingHash local_ee0;
  iterator local_ed8;
  iterator ppStack_ed0;
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  local_ec8;
  undefined1 local_7c8 [8];
  TypeParam m;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> local_78;
  EnumClass local_68;
  int local_60;
  EnumClass local_58;
  int local_50;
  EnumClass local_48;
  int local_40;
  EnumClass local_38;
  int local_30;
  iterator ppStack_28;
  initializer_list<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> values;
  Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> gen;
  AssignmentFromInitializerList<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
  *this_local;
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>
  *matcher;
  
  this_00 = (Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> *)
            ((long)&values._M_len + 7);
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (this_00);
  local_78.first = pVar4.first;
  local_78.second = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (this_00);
  local_68 = pVar4.first;
  local_60 = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (this_00);
  local_58 = pVar4.first;
  local_50 = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (this_00);
  local_48 = pVar4.first;
  local_40 = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (this_00);
  m.
  super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = pVar4.first;
  local_30 = pVar4.second;
  ppStack_28 = &local_78;
  values._M_array = (iterator)0x5;
  local_38 = m.
             super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
             .sets_._M_elems[0xf].set_.settings_.
             super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
             .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  ::parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
              *)local_7c8);
  local_ed8 = ppStack_28;
  ppStack_ed0 = values._M_array;
  local_ee0.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  StatefulTestingHash::StatefulTestingHash(&local_ee0);
  local_ef8[0].super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(local_ef8);
  Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>::Alloc
            ((Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> *)
             &gtest_ar.message_,0);
  iVar1._M_len = (size_type)ppStack_ed0;
  iVar1._M_array = local_ed8;
  sVar3 = 0;
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  ::parallel_hash_set(&local_ec8,iVar1,0,&local_ee0,local_ef8,(allocator_type *)&gtest_ar.message_);
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  ::operator=((parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
               *)local_7c8,&local_ec8);
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  ::~parallel_flat_hash_map(&local_ec8);
  Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>::~Alloc
            ((Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> *)
             &gtest_ar.message_);
  local_f68 = ppStack_28;
  ppStack_f60 = values._M_array;
  xs._M_len = sVar3;
  xs._M_array = values._M_array;
  testing::UnorderedElementsAreArray<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>
            (&local_f50,(testing *)ppStack_28,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
            (&local_f30,(internal *)&local_f50,matcher);
  items<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,4ul,std::mutex>>
            (&local_f80,(priv *)local_7c8,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::operator()(local_f10,(char *)&local_f30,
               (vector<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
                *)"items(m)");
  std::
  vector<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~vector(&local_f80);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~PredicateFormatterFromMatcher(&local_f30);
  testing::internal::
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>::
  ~UnorderedElementsAreArrayMatcher(&local_f50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f10);
  if (!bVar2) {
    testing::Message::Message(&local_f88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f10);
    testing::internal::AssertHelper::AssertHelper
              (&local_f90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1b6,message);
    testing::internal::AssertHelper::operator=(&local_f90,&local_f88);
    testing::internal::AssertHelper::~AssertHelper(&local_f90);
    testing::Message::~Message(&local_f88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f10);
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
              *)local_7c8);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerList) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}